

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O0

void __thiscall
andres::View<unsigned_char,_false,_std::allocator<unsigned_long>_>::View
          (View<unsigned_char,_false,_std::allocator<unsigned_long>_> *this,
          allocator_type *allocator)

{
  allocator<unsigned_long> local_19;
  allocator_type *local_18;
  allocator_type *allocator_local;
  View<unsigned_char,_false,_std::allocator<unsigned_long>_> *this_local;
  
  this->data_ = (pointer)0x0;
  local_18 = allocator;
  allocator_local = (allocator_type *)this;
  std::allocator<unsigned_long>::allocator<unsigned_char>(&local_19,allocator);
  marray_detail::Geometry<std::allocator<unsigned_long>_>::Geometry(&this->geometry_,&local_19);
  std::allocator<unsigned_long>::~allocator(&local_19);
  testInvariant(this);
  return;
}

Assistant:

inline
View<T, isConst, A>::View
(
    const allocator_type& allocator
)
: data_(0),
  geometry_(geometry_type(allocator))
{
    testInvariant();
}